

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::setPose(SlicePlane *this,vec3 planePosition,vec3 planeNormal)

{
  float fVar1;
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar2;
  col_type *pcVar3;
  float *pfVar4;
  vec<3,_float,_(glm::qualifier)0> *in_RDI;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *this_00;
  float fVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 in_ZMM2 [64];
  vec<3,_float,_(glm::qualifier)0> vVar14;
  int i_3;
  int i_2;
  int i_1;
  int i;
  mat4x4 newTransform;
  vec3 basisY;
  vec3 basisX;
  vec3 normal;
  vec3 currBasisY;
  vec3 currBasisX;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe18;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe20;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe28;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe88;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *in_stack_fffffffffffffe90;
  vec<3,_float,_(glm::qualifier)0> local_124;
  vec<3,_float,_(glm::qualifier)0> local_118;
  vec<3,_float,_(glm::qualifier)0> local_108;
  vec<3,_float,_(glm::qualifier)0> local_f8;
  undefined8 local_e8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_e0;
  undefined8 local_d8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_d0;
  vec<3,_float,_(glm::qualifier)0> local_cc;
  vec<3,_float,_(glm::qualifier)0> local_c0;
  undefined8 local_b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_a8;
  undefined8 local_a0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_98;
  vec<3,_float,_(glm::qualifier)0> local_90;
  vec<3,_float,_(glm::qualifier)0> local_80;
  vec<3,_float,_(glm::qualifier)0> local_70;
  vec<3,_float,_(glm::qualifier)0> local_60;
  vec<3,_float,_(glm::qualifier)0> local_54;
  undefined8 local_40;
  undefined8 local_30;
  vec<3,_float,_(glm::qualifier)0> local_20;
  vec<3,_float,_(glm::qualifier)0> local_10;
  undefined1 auVar13 [56];
  
  local_20._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  local_40 = vmovlpd_avx(in_ZMM2._0_16_);
  this_00 = &in_RDI[0xf].field_1;
  local_30 = local_40;
  local_10._0_8_ = local_20._0_8_;
  pmVar2 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
                     ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)this_00);
  pcVar3 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar2,1);
  pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar3,0);
  fVar5 = *pfVar4;
  pmVar2 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
                     ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)this_00);
  pcVar3 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar2,1);
  pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar3,1);
  fVar1 = *pfVar4;
  pmVar2 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
                     ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)this_00);
  pcVar3 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar2,1);
  pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar3,2);
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_54,fVar5,fVar1,*pfVar4);
  pmVar2 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
                     ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)this_00);
  pcVar3 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar2,2);
  pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar3,0);
  fVar5 = *pfVar4;
  pmVar2 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
                     ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)this_00);
  pcVar3 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar2,2);
  pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar3,1);
  fVar1 = *pfVar4;
  pmVar2 = PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
                     ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)this_00);
  pcVar3 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](pmVar2,2);
  pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar3,2);
  auVar13 = (undefined1  [56])0x0;
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_60,fVar5,fVar1,*pfVar4);
  vVar14 = glm::normalize<3,float,(glm::qualifier)0>(in_stack_fffffffffffffe20);
  local_80.field_2 = vVar14.field_2;
  auVar6._0_8_ = vVar14._0_8_;
  auVar6._8_56_ = auVar13;
  local_80._0_8_ = vmovlpd_avx(auVar6._0_16_);
  local_70._0_8_ = local_80._0_8_;
  local_70.field_2 = local_80.field_2;
  glm::dot<3,float,(glm::qualifier)0>
            ((vec<3,_float,_(glm::qualifier)0> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             (vec<3,_float,_(glm::qualifier)0> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  auVar13 = extraout_var;
  vVar14 = glm::operator*(in_stack_fffffffffffffe20,
                          (float)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  local_a8 = vVar14.field_2;
  auVar7._0_8_ = vVar14._0_8_;
  auVar7._8_56_ = auVar13;
  local_b0 = vmovlpd_avx(auVar7._0_16_);
  local_a0 = local_b0;
  local_98 = local_a8;
  vVar14 = glm::operator-(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_c0.field_2 = vVar14.field_2;
  auVar8._0_8_ = vVar14._0_8_;
  auVar8._8_56_ = auVar13;
  local_c0._0_8_ = vmovlpd_avx(auVar8._0_16_);
  local_90._0_8_ = local_c0._0_8_;
  local_90.field_2 = local_c0.field_2;
  fVar5 = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)0x46368f);
  auVar13 = ZEXT856(0);
  if (fVar5 < 0.01) {
    in_stack_fffffffffffffe20 = &local_70;
    in_stack_fffffffffffffe28 = &local_60;
    glm::dot<3,float,(glm::qualifier)0>
              ((vec<3,_float,_(glm::qualifier)0> *)
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               (vec<3,_float,_(glm::qualifier)0> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    auVar13 = extraout_var_00;
    vVar14 = glm::operator*(in_stack_fffffffffffffe20,
                            (float)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    local_e0 = vVar14.field_2;
    auVar9._0_8_ = vVar14._0_8_;
    auVar9._8_56_ = auVar13;
    local_e8 = vmovlpd_avx(auVar9._0_16_);
    local_d8 = local_e8;
    local_d0 = local_e0;
    vVar14 = glm::operator-(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_f8.field_2 = vVar14.field_2;
    auVar10._0_8_ = vVar14._0_8_;
    auVar10._8_56_ = auVar13;
    local_f8._0_8_ = vmovlpd_avx(auVar10._0_16_);
    local_cc._0_8_ = local_f8._0_8_;
    local_cc.field_2 = local_f8.field_2;
    local_90._0_8_ = local_f8._0_8_;
    local_90.field_2 = local_f8.field_2;
  }
  vVar14 = glm::normalize<3,float,(glm::qualifier)0>(in_stack_fffffffffffffe20);
  local_118.field_2 = vVar14.field_2;
  auVar11._0_8_ = vVar14._0_8_;
  auVar11._8_56_ = auVar13;
  local_118._0_8_ = vmovlpd_avx(auVar11._0_16_);
  local_108._0_8_ = local_118._0_8_;
  local_108.field_2 = local_118.field_2;
  local_90._0_8_ = local_118._0_8_;
  local_90.field_2 = local_118.field_2;
  vVar14 = glm::cross<float,(glm::qualifier)0>(in_RDI,in_stack_fffffffffffffe28);
  local_124.field_2 = vVar14.field_2;
  auVar12._0_8_ = vVar14._0_8_;
  auVar12._8_56_ = auVar13;
  local_124._0_8_ = vmovlpd_avx(auVar12._0_16_);
  glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
            ((mat<4,_4,_float,_(glm::qualifier)0> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             (float *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  for (local_180 = 0; local_180 < 3; local_180 = local_180 + 1) {
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_70,local_180);
    fVar5 = *pfVar4;
    pcVar3 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)&stack0xfffffffffffffe88,0);
    pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar3,local_180);
    *pfVar4 = fVar5;
  }
  for (local_184 = 0; local_184 < 3; local_184 = local_184 + 1) {
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_90,local_184);
    fVar5 = *pfVar4;
    pcVar3 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)&stack0xfffffffffffffe88,1);
    pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar3,local_184);
    *pfVar4 = fVar5;
  }
  for (local_188 = 0; local_188 < 3; local_188 = local_188 + 1) {
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_124,local_188);
    fVar5 = *pfVar4;
    pcVar3 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)&stack0xfffffffffffffe88,2);
    pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar3,local_188);
    *pfVar4 = fVar5;
  }
  for (local_18c = 0; local_18c < 3; local_18c = local_18c + 1) {
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_10,local_18c);
    fVar5 = *pfVar4;
    pcVar3 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)&stack0xfffffffffffffe88,3);
    pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar3,local_18c);
    *pfVar4 = fVar5;
  }
  PersistentValue<glm::mat<4,4,float,(glm::qualifier)0>>::operator=
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setPose(glm::vec3 planePosition, glm::vec3 planeNormal) {

  // Choose the other axes to be most similar to the current ones, which will make animations look smoother
  // if the grid is shown
  glm::vec3 currBasisX{objectTransform.get()[1][0], objectTransform.get()[1][1], objectTransform.get()[1][2]};
  glm::vec3 currBasisY{objectTransform.get()[2][0], objectTransform.get()[2][1], objectTransform.get()[2][2]};

  glm::vec3 normal = glm::normalize(planeNormal);
  glm::vec3 basisX = currBasisX - normal * glm::dot(normal, currBasisX);
  if (glm::length(basisX) < 0.01) basisX = currBasisY - normal * glm::dot(normal, currBasisY);
  basisX = glm::normalize(basisX);
  glm::vec3 basisY = glm::cross(normal, basisX);

  // Build the rotation component
  glm::mat4x4 newTransform = glm::mat4x4(1.0);
  for (int i = 0; i < 3; i++) newTransform[0][i] = normal[i];
  for (int i = 0; i < 3; i++) newTransform[1][i] = basisX[i];
  for (int i = 0; i < 3; i++) newTransform[2][i] = basisY[i];

  // Build the translation component
  for (int i = 0; i < 3; i++) newTransform[3][i] = planePosition[i];

  objectTransform = newTransform;
  polyscope::requestRedraw();
}